

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt.cpp
# Opt level: O0

pair<docopt::Required,_std::vector<docopt::Option,_std::allocator<docopt::Option>_>_> *
create_pattern_tree(string *doc)

{
  __normal_iterator<const_docopt::Option_**,_std::vector<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>_>
  __first;
  bool bVar1;
  size_type sVar2;
  undefined8 uVar3;
  iterator doc_00;
  reference pOVar4;
  size_type sVar5;
  pair<docopt::Required,_std::vector<docopt::Option,_std::allocator<docopt::Option>_>_> *in_RDI;
  pair<std::__detail::_Node_iterator<const_docopt::Option_*,_true,_true>,_bool> pVar6;
  PatternList children;
  Option *opt;
  iterator __end2;
  iterator __begin2;
  vector<docopt::Option,_std::allocator<docopt::Option>_> *__range2;
  UniqueOptions uniq_doc_options;
  vector<docopt::Option,_std::allocator<docopt::Option>_> doc_options;
  OptionsShortcut **options_shortcut;
  iterator __end1;
  iterator __begin1;
  vector<docopt::OptionsShortcut_*,_std::allocator<docopt::OptionsShortcut_*>_> *__range1;
  UniqueOptions uniq_pattern_options;
  vector<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_> pattern_options;
  Required pattern;
  vector<docopt::Option,_std::allocator<docopt::Option>_> options;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  usage_sections;
  vector<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_> *in_stack_fffffffffffffd38
  ;
  unordered_set<const_docopt::Option_*,_docopt::PatternHasher,_docopt::PatternPointerEquality,_std::allocator<const_docopt::Option_*>_>
  *this;
  BranchPattern *in_stack_fffffffffffffd40;
  key_equal *in_stack_fffffffffffffd48;
  back_insert_iterator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
  in_stack_fffffffffffffd50;
  size_type in_stack_fffffffffffffd58;
  unordered_set<const_docopt::Option_*,_docopt::PatternHasher,_docopt::PatternPointerEquality,_std::allocator<const_docopt::Option_*>_>
  *in_stack_fffffffffffffd60;
  __normal_iterator<const_docopt::Option_**,_std::vector<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>_>
  in_stack_fffffffffffffd68;
  undefined7 in_stack_fffffffffffffd70;
  undefined1 in_stack_fffffffffffffd77;
  allocator_type *in_stack_fffffffffffffd80;
  string *in_stack_fffffffffffffd98;
  allocator *pattern_00;
  key_equal local_240 [24];
  vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  *local_228;
  vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  *local_218;
  _Node_iterator_base<const_docopt::Option_*,_true> local_210;
  _Node_iterator_base<const_docopt::Option_*,_true> local_208;
  _Node_iterator_base<const_docopt::Option_*,_true> local_1e8;
  undefined1 local_1e0;
  reference local_1d8;
  vector<docopt::Option,_std::allocator<docopt::Option>_> *in_stack_fffffffffffffe30;
  string *in_stack_fffffffffffffe38;
  __normal_iterator<docopt::Option_*,_std::vector<docopt::Option,_std::allocator<docopt::Option>_>_>
  local_1b8;
  undefined1 *local_1b0;
  string *in_stack_fffffffffffffe60;
  string *in_stack_fffffffffffffe68;
  undefined1 local_170 [24];
  reference local_158;
  OptionsShortcut **local_150;
  __normal_iterator<docopt::OptionsShortcut_**,_std::vector<docopt::OptionsShortcut_*,_std::allocator<docopt::OptionsShortcut_*>_>_>
  local_148;
  undefined1 local_140 [24];
  undefined1 *local_128;
  string *in_stack_fffffffffffffee8;
  string local_b8 [111];
  allocator local_49;
  string local_48 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_28;
  
  pattern_00 = &local_49;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"usage:",pattern_00);
  parse_section(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffd50.container);
  if (bVar1) {
    uVar3 = __cxa_allocate_exception(0x10);
    docopt::DocoptLanguageError::runtime_error
              ((DocoptLanguageError *)in_stack_fffffffffffffd40,(char *)in_stack_fffffffffffffd38);
    __cxa_throw(uVar3,&docopt::DocoptLanguageError::typeinfo,
                docopt::DocoptLanguageError::~DocoptLanguageError);
  }
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&local_28);
  if (sVar2 < 2) {
    parse_defaults(in_stack_fffffffffffffee8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&local_28,0);
    formal_usage(in_stack_fffffffffffffd98);
    parse_pattern(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
    std::__cxx11::string::~string(local_b8);
    flat_filter<docopt::Option_const>((Pattern *)pattern_00);
    std::vector<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>::begin
              (in_stack_fffffffffffffd38);
    doc_00 = std::vector<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>::end
                       (in_stack_fffffffffffffd38);
    this = (unordered_set<const_docopt::Option_*,_docopt::PatternHasher,_docopt::PatternPointerEquality,_std::allocator<const_docopt::Option_*>_>
            *)&stack0xfffffffffffffee5;
    std::allocator<const_docopt::Option_*>::allocator((allocator<const_docopt::Option_*> *)0x2bb1dc)
    ;
    __first._M_current._7_1_ = in_stack_fffffffffffffd77;
    __first._M_current._0_7_ = in_stack_fffffffffffffd70;
    std::
    unordered_set<docopt::Option_const*,docopt::PatternHasher,docopt::PatternPointerEquality,std::allocator<docopt::Option_const*>>
    ::
    unordered_set<__gnu_cxx::__normal_iterator<docopt::Option_const**,std::vector<docopt::Option_const*,std::allocator<docopt::Option_const*>>>>
              (in_stack_fffffffffffffd60,__first,in_stack_fffffffffffffd68,in_stack_fffffffffffffd58
               ,(hasher *)in_stack_fffffffffffffd50.container,in_stack_fffffffffffffd48,
               in_stack_fffffffffffffd80);
    std::allocator<const_docopt::Option_*>::~allocator
              ((allocator<const_docopt::Option_*> *)0x2bb227);
    flat_filter<docopt::OptionsShortcut>((Pattern *)pattern_00);
    local_128 = local_140;
    local_148._M_current =
         (OptionsShortcut **)
         std::vector<docopt::OptionsShortcut_*,_std::allocator<docopt::OptionsShortcut_*>_>::begin
                   ((vector<docopt::OptionsShortcut_*,_std::allocator<docopt::OptionsShortcut_*>_> *
                    )this);
    local_150 = (OptionsShortcut **)
                std::vector<docopt::OptionsShortcut_*,_std::allocator<docopt::OptionsShortcut_*>_>::
                end((vector<docopt::OptionsShortcut_*,_std::allocator<docopt::OptionsShortcut_*>_> *
                    )this);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<docopt::OptionsShortcut_**,_std::vector<docopt::OptionsShortcut_*,_std::allocator<docopt::OptionsShortcut_*>_>_>
                               *)in_stack_fffffffffffffd40,
                              (__normal_iterator<docopt::OptionsShortcut_**,_std::vector<docopt::OptionsShortcut_*,_std::allocator<docopt::OptionsShortcut_*>_>_>
                               *)this), bVar1) {
      local_158 = __gnu_cxx::
                  __normal_iterator<docopt::OptionsShortcut_**,_std::vector<docopt::OptionsShortcut_*,_std::allocator<docopt::OptionsShortcut_*>_>_>
                  ::operator*(&local_148);
      parse_defaults((string *)doc_00._M_current);
      std::
      unordered_set<const_docopt::Option_*,_docopt::PatternHasher,_docopt::PatternPointerEquality,_std::allocator<const_docopt::Option_*>_>
      ::unordered_set((unordered_set<const_docopt::Option_*,_docopt::PatternHasher,_docopt::PatternPointerEquality,_std::allocator<const_docopt::Option_*>_>
                       *)0x2bb377);
      local_1b0 = local_170;
      local_1b8._M_current =
           (Option *)
           std::vector<docopt::Option,_std::allocator<docopt::Option>_>::begin
                     ((vector<docopt::Option,_std::allocator<docopt::Option>_> *)this);
      std::vector<docopt::Option,_std::allocator<docopt::Option>_>::end
                ((vector<docopt::Option,_std::allocator<docopt::Option>_> *)this);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<docopt::Option_*,_std::vector<docopt::Option,_std::allocator<docopt::Option>_>_>
                                 *)in_stack_fffffffffffffd40,
                                (__normal_iterator<docopt::Option_*,_std::vector<docopt::Option,_std::allocator<docopt::Option>_>_>
                                 *)this), bVar1) {
        pOVar4 = __gnu_cxx::
                 __normal_iterator<docopt::Option_*,_std::vector<docopt::Option,_std::allocator<docopt::Option>_>_>
                 ::operator*(&local_1b8);
        sVar5 = std::
                unordered_set<const_docopt::Option_*,_docopt::PatternHasher,_docopt::PatternPointerEquality,_std::allocator<const_docopt::Option_*>_>
                ::count((unordered_set<const_docopt::Option_*,_docopt::PatternHasher,_docopt::PatternPointerEquality,_std::allocator<const_docopt::Option_*>_>
                         *)in_stack_fffffffffffffd40,(key_type *)this);
        if (sVar5 == 0) {
          local_1d8 = pOVar4;
          pVar6 = std::
                  unordered_set<const_docopt::Option_*,_docopt::PatternHasher,_docopt::PatternPointerEquality,_std::allocator<const_docopt::Option_*>_>
                  ::insert((unordered_set<const_docopt::Option_*,_docopt::PatternHasher,_docopt::PatternPointerEquality,_std::allocator<const_docopt::Option_*>_>
                            *)in_stack_fffffffffffffd50.container,
                           (value_type *)in_stack_fffffffffffffd48);
          local_1e8._M_cur =
               (__node_type *)
               pVar6.first.super__Node_iterator_base<const_docopt::Option_*,_true>._M_cur;
          local_1e0 = pVar6.second;
        }
        __gnu_cxx::
        __normal_iterator<docopt::Option_*,_std::vector<docopt::Option,_std::allocator<docopt::Option>_>_>
        ::operator++(&local_1b8);
      }
      std::
      vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
      vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
              *)0x2bb4bb);
      local_208._M_cur =
           (__node_type *)
           std::
           unordered_set<const_docopt::Option_*,_docopt::PatternHasher,_docopt::PatternPointerEquality,_std::allocator<const_docopt::Option_*>_>
           ::begin(this);
      local_210._M_cur =
           (__node_type *)
           std::
           unordered_set<const_docopt::Option_*,_docopt::PatternHasher,_docopt::PatternPointerEquality,_std::allocator<const_docopt::Option_*>_>
           ::end(this);
      local_218 = (vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                   *)std::
                     back_inserter<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>
                               ((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                                 *)this);
      in_stack_fffffffffffffd50 =
           std::
           transform<std::__detail::_Node_iterator<docopt::Option_const*,true,true>,std::back_insert_iterator<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>,create_pattern_tree(std::__cxx11::string_const&)::__0>
                     (local_208._M_cur,local_210._M_cur,local_218);
      in_stack_fffffffffffffd40 = (BranchPattern *)*local_158;
      in_stack_fffffffffffffd48 = local_240;
      local_228 = (vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                   *)in_stack_fffffffffffffd50;
      std::
      vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
      vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
              *)in_stack_fffffffffffffd40,
             (vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
              *)this);
      docopt::BranchPattern::setChildren(in_stack_fffffffffffffd40,(PatternList *)this);
      std::
      vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
      ~vector(in_stack_fffffffffffffd50.container);
      std::
      vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
      ~vector(in_stack_fffffffffffffd50.container);
      std::
      unordered_set<const_docopt::Option_*,_docopt::PatternHasher,_docopt::PatternPointerEquality,_std::allocator<const_docopt::Option_*>_>
      ::~unordered_set((unordered_set<const_docopt::Option_*,_docopt::PatternHasher,_docopt::PatternPointerEquality,_std::allocator<const_docopt::Option_*>_>
                        *)0x2bb598);
      std::vector<docopt::Option,_std::allocator<docopt::Option>_>::~vector
                ((vector<docopt::Option,_std::allocator<docopt::Option>_> *)
                 in_stack_fffffffffffffd50.container);
      __gnu_cxx::
      __normal_iterator<docopt::OptionsShortcut_**,_std::vector<docopt::OptionsShortcut_*,_std::allocator<docopt::OptionsShortcut_*>_>_>
      ::operator++(&local_148);
    }
    std::vector<docopt::OptionsShortcut_*,_std::allocator<docopt::OptionsShortcut_*>_>::~vector
              ((vector<docopt::OptionsShortcut_*,_std::allocator<docopt::OptionsShortcut_*>_> *)
               in_stack_fffffffffffffd50.container);
    std::pair<docopt::Required,_std::vector<docopt::Option,_std::allocator<docopt::Option>_>_>::
    pair<docopt::Required,_std::vector<docopt::Option,_std::allocator<docopt::Option>_>,_true>
              ((pair<docopt::Required,_std::vector<docopt::Option,_std::allocator<docopt::Option>_>_>
                *)in_stack_fffffffffffffd50.container,(Required *)in_stack_fffffffffffffd48,
               (vector<docopt::Option,_std::allocator<docopt::Option>_> *)in_stack_fffffffffffffd40)
    ;
    std::
    unordered_set<const_docopt::Option_*,_docopt::PatternHasher,_docopt::PatternPointerEquality,_std::allocator<const_docopt::Option_*>_>
    ::~unordered_set((unordered_set<const_docopt::Option_*,_docopt::PatternHasher,_docopt::PatternPointerEquality,_std::allocator<const_docopt::Option_*>_>
                      *)0x2bb64d);
    std::vector<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>::~vector
              ((vector<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_> *)
               in_stack_fffffffffffffd50.container);
    docopt::Required::~Required((Required *)0x2bb667);
    std::vector<docopt::Option,_std::allocator<docopt::Option>_>::~vector
              ((vector<docopt::Option,_std::allocator<docopt::Option>_> *)
               in_stack_fffffffffffffd50.container);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffd50.container);
    return in_RDI;
  }
  uVar3 = __cxa_allocate_exception(0x10);
  docopt::DocoptLanguageError::runtime_error
            ((DocoptLanguageError *)in_stack_fffffffffffffd40,(char *)in_stack_fffffffffffffd38);
  __cxa_throw(uVar3,&docopt::DocoptLanguageError::typeinfo,
              docopt::DocoptLanguageError::~DocoptLanguageError);
}

Assistant:

std::pair<Required, std::vector<Option>> create_pattern_tree(std::string const& doc)
{
	auto usage_sections = parse_section("usage:", doc);
	if (usage_sections.empty()) {
		throw DocoptLanguageError("'usage:' (case-insensitive) not found.");
	}
	if (usage_sections.size() > 1) {
		throw DocoptLanguageError("More than one 'usage:' (case-insensitive).");
	}
	
	std::vector<Option> options = parse_defaults(doc);
	Required pattern = parse_pattern(formal_usage(usage_sections[0]), options);
	
	std::vector<Option const*> pattern_options = flat_filter<Option const>(pattern);
	
	using UniqueOptions = std::unordered_set<Option const*, PatternHasher, PatternPointerEquality>;
	UniqueOptions const uniq_pattern_options { pattern_options.begin(), pattern_options.end() };
	
	// Fix up any "[options]" shortcuts with the actual option tree
	for(auto& options_shortcut : flat_filter<OptionsShortcut>(pattern)) {
		std::vector<Option> doc_options = parse_defaults(doc);
		
		// set(doc_options) - set(pattern_options)
		UniqueOptions uniq_doc_options;
		for(auto const& opt : doc_options) {
			if (uniq_pattern_options.count(&opt))
				continue;
			uniq_doc_options.insert(&opt);
		}
		
		// turn into shared_ptr's and set as children
		PatternList children;
		std::transform(uniq_doc_options.begin(), uniq_doc_options.end(),
			       std::back_inserter(children), [](Option const* opt) {
				       return std::make_shared<Option>(*opt);
			       });
		options_shortcut->setChildren(std::move(children));
	}
	
	return { std::move(pattern), std::move(options) };
}